

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_fixups.cpp
# Opt level: O2

czstring pstore::exchange::export_ns::emit_section_name(section_kind section)

{
  if (section < last) {
    return &DAT_00125328 + *(int *)(&DAT_00125328 + (ulong)section * 4);
  }
  return "unknown";
}

Assistant:

gsl::czstring emit_section_name (repo::section_kind const section) noexcept {
                auto const * result = "unknown";
#define X(a)                                                                                       \
    case pstore::repo::section_kind::a: result = #a; break;
                switch (section) {
                    PSTORE_MCREPO_SECTION_KINDS
                case pstore::repo::section_kind::last: break;
                }
#undef X
                return result;
            }